

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandReconcile(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Io_FileType_t IVar2;
  Abc_Cex_t *in_RAX;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  Aig_Man_t *pAigOrg;
  Aig_Man_t *pAigRpm;
  Abc_Cex_t *pAVar3;
  char *pcVar4;
  Abc_Cex_t *pCex;
  Abc_Cex_t *local_38;
  
  local_38 = in_RAX;
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 != -1) {
    if (iVar1 != 0x68) {
      Abc_Print(-2,"Unknown switch.\n");
    }
    Abc_Print(-2,"usage: reconcile [-h] <fileOrigin> <fileReparam>\n");
    Abc_Print(-2,"\t        reconciles current CEX with <fileOrigin>\n");
    Abc_Print(-2,"\t        More specifically:\n");
    Abc_Print(-2,"\t        (i) assumes that <fileReparam> is an AIG derived by input\n");
    Abc_Print(-2,"\t        reparametrization of <fileOrigin> without seq synthesis;\n");
    Abc_Print(-2,"\t        (ii) assumes that current CEX is valid for <fileReparam>;\n");
    Abc_Print(-2,"\t        (iii) derives new CEX for <fileOrigin> and sets this CEX\n");
    Abc_Print(-2,"\t        and <fileOrigin> to be current CEX and current network\n");
    Abc_Print(-2,"\t<fileOrigin>   : file name with the original AIG\n");
    Abc_Print(-2,"\t<fileReparam>  : file name with the reparametrized AIG\n");
    Abc_Print(-2,"\t        (if both file names are not given on the command line,\n");
    Abc_Print(-2,"\t        original/reparam AIG has to be in the main-space/&-space)\n");
    Abc_Print(-2,"\t-h    : print the command usage\n");
    return 1;
  }
  if (globalUtilOptind == argc || globalUtilOptind + 2 == argc) {
    if (pAbc->pCex != (Abc_Cex_t *)0x0) {
      if (globalUtilOptind + 2 == argc) {
        pcVar4 = argv[globalUtilOptind];
        IVar2 = Io_ReadFileType(pcVar4);
        pNtk = Io_Read(pcVar4,IVar2,1,0);
        if (pNtk == (Abc_Ntk_t *)0x0) {
          return 1;
        }
        pcVar4 = argv[(long)globalUtilOptind + 1];
        IVar2 = Io_ReadFileType(pcVar4);
        pNtk_00 = Io_Read(pcVar4,IVar2,1,0);
        if (pNtk_00 == (Abc_Ntk_t *)0x0) goto LAB_00275cef;
        pAigOrg = Abc_NtkToDar(pNtk,0,0);
        pAigRpm = Abc_NtkToDar(pNtk_00,0,0);
LAB_00275c5e:
        pAVar3 = Llb4_Nonlin4NormalizeCex(pAigOrg,pAigRpm,pAbc->pCex);
        local_38 = pAVar3;
        Aig_ManStop(pAigOrg);
        Aig_ManStop(pAigRpm);
        if (pNtk_00 != (Abc_Ntk_t *)0x0) {
          Abc_NtkDelete(pNtk_00);
        }
        if (pAVar3 != (Abc_Cex_t *)0x0) {
          if (pNtk != (Abc_Ntk_t *)0x0) {
            Abc_FrameReplaceCurrentNetwork(pAbc,pNtk);
          }
          pAbc->nFrames = pAVar3->iFrame;
          Abc_FrameReplaceCex(pAbc,&local_38);
          return 0;
        }
        Abc_Print(1,"Counter-example computation has failed.\n");
        if (pNtk == (Abc_Ntk_t *)0x0) {
          return 1;
        }
LAB_00275cef:
        Abc_NtkDelete(pNtk);
        return 1;
      }
      if (globalUtilOptind != argc) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abc.c"
                      ,0x7128,"int Abc_CommandReconcile(Abc_Frame_t *, int, char **)");
      }
      if (pAbc->pNtkCur == (Abc_Ntk_t *)0x0) {
        pcVar4 = "There is no AIG in the main-space.\n";
      }
      else {
        if (pAbc->pGia != (Gia_Man_t *)0x0) {
          pNtk = (Abc_Ntk_t *)0x0;
          pAigOrg = Abc_NtkToDar(pAbc->pNtkCur,0,0);
          pAigRpm = Gia_ManToAigSimple(pAbc->pGia);
          pNtk_00 = (Abc_Ntk_t *)0x0;
          goto LAB_00275c5e;
        }
        pcVar4 = "There is no AIG in the &-space.\n";
      }
      iVar1 = 0;
      goto LAB_00275bfd;
    }
    pcVar4 = "There is no current counter-example.\n";
  }
  else {
    pcVar4 = "Does not seen to have two files names as arguments.\n";
  }
  iVar1 = 1;
LAB_00275bfd:
  Abc_Print(1,pcVar4);
  return iVar1;
}

Assistant:

int Abc_CommandReconcile( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Cex_t * Llb4_Nonlin4NormalizeCex( Aig_Man_t * pAigOrg, Aig_Man_t * pAigRpm, Abc_Cex_t * pCexRpm );
    Abc_Cex_t * pCex;
    Abc_Ntk_t * pNtk1 = NULL, * pNtk2 = NULL;
    Aig_Man_t * pAig1 = NULL, * pAig2 = NULL;
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }

    if ( argc != globalUtilOptind + 2 && argc != globalUtilOptind )
    {
        Abc_Print( 1,"Does not seen to have two files names as arguments.\n" );
        return 1;
    }
    if ( pAbc->pCex == NULL )
    {
        Abc_Print( 1,"There is no current counter-example.\n" );
        return 1;
    }

    if ( argc == globalUtilOptind + 2 )
    {
        // derive networks
        pNtk1 = Io_Read( argv[globalUtilOptind], Io_ReadFileType(argv[globalUtilOptind]), 1, 0 );
        if ( pNtk1 == NULL )
            return 1;
        pNtk2 = Io_Read( argv[globalUtilOptind+1], Io_ReadFileType(argv[globalUtilOptind+1]), 1, 0 );
        if ( pNtk2 == NULL )
        {
            Abc_NtkDelete( pNtk1 );
            return 1;
        }
        // create counter-examples
        pAig1 = Abc_NtkToDar( pNtk1, 0, 0 );
        pAig2 = Abc_NtkToDar( pNtk2, 0, 0 );
    }
    else if ( argc == globalUtilOptind )
    {
        if ( pAbc->pNtkCur == NULL )
        {
            Abc_Print( 1, "There is no AIG in the main-space.\n");
            return 0;
        }
        if ( pAbc->pGia == NULL )
        {
            Abc_Print( 1, "There is no AIG in the &-space.\n");
            return 0;
        }
        // create counter-examples
        pAig1 = Abc_NtkToDar( pAbc->pNtkCur, 0, 0 );
        pAig2 = Gia_ManToAigSimple( pAbc->pGia );
    }
    else assert( 0 );
    pCex = Llb4_Nonlin4NormalizeCex( pAig1, pAig2, pAbc->pCex );
    Aig_ManStop( pAig1 );
    Aig_ManStop( pAig2 );
    if ( pNtk2 )  Abc_NtkDelete( pNtk2 );
    if ( pCex == NULL )
    {
        Abc_Print( 1,"Counter-example computation has failed.\n" );
        if ( pNtk1 )  Abc_NtkDelete( pNtk1 );
        return 1;
    }

    // replace the current network
    if ( pNtk1 )
        Abc_FrameReplaceCurrentNetwork( pAbc, pNtk1 );
    // update the counter-example
    pAbc->nFrames = pCex->iFrame;
    Abc_FrameReplaceCex( pAbc, &pCex );
    return 0;

usage:
    Abc_Print( -2, "usage: reconcile [-h] <fileOrigin> <fileReparam>\n" );
    Abc_Print( -2, "\t        reconciles current CEX with <fileOrigin>\n" );
    Abc_Print( -2, "\t        More specifically:\n" );
    Abc_Print( -2, "\t        (i) assumes that <fileReparam> is an AIG derived by input\n" );
    Abc_Print( -2, "\t        reparametrization of <fileOrigin> without seq synthesis;\n" );
    Abc_Print( -2, "\t        (ii) assumes that current CEX is valid for <fileReparam>;\n" );
    Abc_Print( -2, "\t        (iii) derives new CEX for <fileOrigin> and sets this CEX\n" );
    Abc_Print( -2, "\t        and <fileOrigin> to be current CEX and current network\n" );
    Abc_Print( -2, "\t<fileOrigin>   : file name with the original AIG\n");
    Abc_Print( -2, "\t<fileReparam>  : file name with the reparametrized AIG\n");
    Abc_Print( -2, "\t        (if both file names are not given on the command line,\n");
    Abc_Print( -2, "\t        original/reparam AIG has to be in the main-space/&-space)\n");
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}